

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_GLSL_DP2ADD(Context *ctx)

{
  size_t in_R8;
  char extra [64];
  char src2 [64];
  char src1 [64];
  char src0 [64];
  char acStack_128 [64];
  char local_e8 [64];
  char local_a8 [64];
  char local_68 [64];
  
  make_GLSL_srcarg_string(ctx,0,3,local_68,in_R8);
  make_GLSL_srcarg_string(ctx,1,3,local_a8,in_R8);
  make_GLSL_srcarg_string(ctx,2,1,local_e8,in_R8);
  snprintf(acStack_128,0x40," + %s",local_e8);
  emit_GLSL_dotprod(ctx,local_68,local_a8,acStack_128);
  return;
}

Assistant:

EMIT_GLSL_OPCODE_UNIMPLEMENTED_FUNC(BEM) // !!! FIXME

static void emit_GLSL_DP2ADD(Context *ctx)
{
    char src0[64]; make_GLSL_srcarg_string_vec2(ctx, 0, src0, sizeof (src0));
    char src1[64]; make_GLSL_srcarg_string_vec2(ctx, 1, src1, sizeof (src1));
    char src2[64]; make_GLSL_srcarg_string_scalar(ctx, 2, src2, sizeof (src2));
    char extra[64]; snprintf(extra, sizeof (extra), " + %s", src2);
    emit_GLSL_dotprod(ctx, src0, src1, extra);
}